

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O2

string * cmStrCat<char[4],char_const*,char>
                   (string *__return_storage_ptr__,cmAlphaNum *a,cmAlphaNum *b,char (*args) [4],
                   char **args_1,char *args_2)

{
  char *__s;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  char local_98 [32];
  basic_string_view<char,_std::char_traits<char>_> local_78;
  size_t local_68;
  char *pcStack_60;
  size_t local_58;
  char (*local_50) [4];
  size_t local_48;
  char *local_40;
  undefined8 local_38;
  char *local_30;
  
  local_78._M_len = (a->View_)._M_len;
  local_78._M_str = (a->View_)._M_str;
  local_68 = (b->View_)._M_len;
  pcStack_60 = (b->View_)._M_str;
  local_58 = strlen(*args);
  __s = *args_1;
  local_50 = args;
  local_48 = strlen(__s);
  local_98[0] = *args_2;
  local_30 = local_98;
  local_38 = 1;
  views._M_len = 5;
  views._M_array = &local_78;
  local_40 = __s;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(cmAlphaNum const& a, cmAlphaNum const& b,
                            AV const&... args)
{
  return cmCatViews(
    { a.View(), b.View(), static_cast<cmAlphaNum const&>(args).View()... });
}